

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O2

void rtmidi_error(MidiApi *api,RtMidiErrorType type,char *errorString)

{
  string msg;
  allocator<char> local_59;
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,errorString,&local_59);
  std::__cxx11::string::string((string *)&local_58,local_38);
  MidiApi::error(api,type,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void rtmidi_error (MidiApi *api, enum RtMidiErrorType type, const char* errorString)
{
  std::string msg = errorString;
  api->error ((RtMidiError::Type) type, msg);
}